

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::getDestinationTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  uchar uVar1;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var2;
  FederateState *pFVar3;
  PublicationInfo *this_00;
  string *psVar4;
  EndpointInfo *this_01;
  
  p_Var2 = getHandleInfo(this,handle);
  if (p_Var2 != (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    uVar1 = (p_Var2->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
            ._M_storage._M_storage.__data[4];
    if (uVar1 == 'e') {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &(p_Var2->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                    ._M_storage._M_storage);
      this_01 = InterfaceInfo::getEndpoint(&pFVar3->interfaceInformation,handle);
      if (this_01 != (EndpointInfo *)0x0) {
        psVar4 = EndpointInfo::getDestinationTargets_abi_cxx11_(this_01);
        return psVar4;
      }
    }
    else if (uVar1 == 'p') {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &(p_Var2->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                    ._M_storage._M_storage);
      this_00 = InterfaceInfo::getPublication(&pFVar3->interfaceInformation,handle);
      if (this_00 != (PublicationInfo *)0x0) {
        psVar4 = PublicationInfo::getTargets_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getDestinationTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT:
                return gEmptyString;
            case InterfaceType::PUBLICATION: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* pubInfo = fed->interfaces().getPublication(handle);
                if (pubInfo != nullptr) {
                    return pubInfo->getTargets();
                }
                break;
            }
            case InterfaceType::ENDPOINT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getDestinationTargets();
                }
                break;
            }
            case InterfaceType::FILTER:
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}